

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithNegativeCount
          (GPUShaderFP64Test1 *this)

{
  GPUShaderFP64Test1 *this_00;
  _uniform_function func;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  TestError *this_01;
  long lVar4;
  long lVar5;
  GLdouble *pGVar6;
  GLdouble *pGVar7;
  GPUShaderFP64Test1 *this_02;
  GLdouble double_values [16];
  undefined1 local_1b0 [384];
  
  pGVar6 = (GLdouble *)&DAT_0168de90;
  pGVar7 = double_values;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pGVar7 = *pGVar6;
    pGVar6 = pGVar6 + 1;
    pGVar7 = pGVar7 + 1;
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  bVar1 = true;
  this_00 = (GPUShaderFP64Test1 *)(local_1b0 + 8);
  for (lVar5 = 0; lVar5 != 0x34; lVar5 = lVar5 + 4) {
    func = *(_uniform_function *)((long)&DAT_0168de50 + lVar5);
    switch(func) {
    case UNIFORM_FUNCTION_1DV:
      (**(code **)(lVar4 + 0x14d8))
                (this->m_po_double_arr_uniform_location,0xffffffffffffffff,double_values);
      break;
    default:
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Unrecognized uniform function",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0xad5);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    case UNIFORM_FUNCTION_2DV:
      (**(code **)(lVar4 + 0x1518))
                (this->m_po_dvec2_arr_uniform_location,0xffffffffffffffff,double_values);
      break;
    case UNIFORM_FUNCTION_3DV:
      (**(code **)(lVar4 + 0x1558))
                (this->m_po_dvec3_arr_uniform_location,0xffffffffffffffff,double_values);
      break;
    case UNIFORM_FUNCTION_4DV:
      (**(code **)(lVar4 + 0x1598))
                (this->m_po_dvec4_arr_uniform_location,0xffffffffffffffff,double_values);
      break;
    case UNIFORM_FUNCTION_MATRIX2DV:
      (**(code **)(lVar4 + 0x15d8))
                (this->m_po_dmat2_arr_uniform_location,0xffffffffffffffff,0,double_values);
      break;
    case UNIFORM_FUNCTION_MATRIX2X3DV:
      (**(code **)(lVar4 + 0x15e8))
                (this->m_po_dmat2x3_arr_uniform_location,0xffffffffffffffff,0,double_values);
      break;
    case UNIFORM_FUNCTION_MATRIX2X4DV:
      (**(code **)(lVar4 + 0x15f8))
                (this->m_po_dmat2x4_arr_uniform_location,0xffffffffffffffff,0,double_values);
      break;
    case UNIFORM_FUNCTION_MATRIX3DV:
      (**(code **)(lVar4 + 0x1608))
                (this->m_po_dmat3_arr_uniform_location,0xffffffffffffffff,0,double_values);
      break;
    case UNIFORM_FUNCTION_MATRIX3X2DV:
      (**(code **)(lVar4 + 0x1618))
                (this->m_po_dmat3x2_arr_uniform_location,0xffffffffffffffff,0,double_values);
      break;
    case UNIFORM_FUNCTION_MATRIX3X4DV:
      (**(code **)(lVar4 + 0x1628))
                (this->m_po_dmat3x4_arr_uniform_location,0xffffffffffffffff,0,double_values);
      break;
    case UNIFORM_FUNCTION_MATRIX4DV:
      (**(code **)(lVar4 + 0x1638))
                (this->m_po_dmat4_arr_uniform_location,0xffffffffffffffff,0,double_values);
      break;
    case UNIFORM_FUNCTION_MATRIX4X2DV:
      (**(code **)(lVar4 + 0x1648))
                (this->m_po_dmat4x2_arr_uniform_location,0xffffffffffffffff,0,double_values);
      break;
    case UNIFORM_FUNCTION_MATRIX4X3DV:
      (**(code **)(lVar4 + 0x1658))
                (this->m_po_dmat4x3_arr_uniform_location,0xffffffffffffffff,0,double_values);
    }
    iVar2 = (**(code **)(lVar4 + 0x800))();
    if (iVar2 != 0x501) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      this_02 = this_00;
      std::operator<<((ostream *)this_00,"Function ");
      pcVar3 = getUniformFunctionString(this_02,func);
      std::operator<<((ostream *)this_00,pcVar3);
      std::operator<<((ostream *)this_00,
                      "() was called with a negative count argument but did not generate a GL_INVALID_VALUE error"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithNegativeCount()
{
	const glw::GLdouble double_values[16] = { 1.0, 2.0,  3.0,  4.0,  5.0,  6.0,  7.0,  8.0,
											  9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0, 16.0 };
	const glw::Functions&   gl					= m_context.getRenderContext().getFunctions();
	bool					result				= true;
	const _uniform_function uniform_functions[] = { UNIFORM_FUNCTION_1DV,		  UNIFORM_FUNCTION_2DV,
													UNIFORM_FUNCTION_3DV,		  UNIFORM_FUNCTION_4DV,
													UNIFORM_FUNCTION_MATRIX2DV,   UNIFORM_FUNCTION_MATRIX2X3DV,
													UNIFORM_FUNCTION_MATRIX2X4DV, UNIFORM_FUNCTION_MATRIX3DV,
													UNIFORM_FUNCTION_MATRIX3X2DV, UNIFORM_FUNCTION_MATRIX3X4DV,
													UNIFORM_FUNCTION_MATRIX4DV,   UNIFORM_FUNCTION_MATRIX4X2DV,
													UNIFORM_FUNCTION_MATRIX4X3DV };
	const unsigned int n_uniform_functions = sizeof(uniform_functions) / sizeof(uniform_functions[0]);

	for (unsigned int n_uniform_function = 0; n_uniform_function < n_uniform_functions; ++n_uniform_function)
	{
		_uniform_function uniform_function = uniform_functions[n_uniform_function];

		switch (uniform_function)
		{
		case UNIFORM_FUNCTION_1DV:
			gl.uniform1dv(m_po_double_arr_uniform_location, -1, double_values);
			break;
		case UNIFORM_FUNCTION_2DV:
			gl.uniform2dv(m_po_dvec2_arr_uniform_location, -1, double_values);
			break;
		case UNIFORM_FUNCTION_3DV:
			gl.uniform3dv(m_po_dvec3_arr_uniform_location, -1, double_values);
			break;
		case UNIFORM_FUNCTION_4DV:
			gl.uniform4dv(m_po_dvec4_arr_uniform_location, -1, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX2DV:
			gl.uniformMatrix2dv(m_po_dmat2_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX2X3DV:
			gl.uniformMatrix2x3dv(m_po_dmat2x3_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX2X4DV:
			gl.uniformMatrix2x4dv(m_po_dmat2x4_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX3DV:
			gl.uniformMatrix3dv(m_po_dmat3_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX3X2DV:
			gl.uniformMatrix3x2dv(m_po_dmat3x2_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX3X4DV:
			gl.uniformMatrix3x4dv(m_po_dmat3x4_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX4DV:
			gl.uniformMatrix4dv(m_po_dmat4_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX4X2DV:
			gl.uniformMatrix4x2dv(m_po_dmat4x2_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX4X3DV:
			gl.uniformMatrix4x3dv(m_po_dmat4x3_arr_uniform_location, -1, GL_FALSE, double_values);
			break;

		default:
		{
			TCU_FAIL("Unrecognized uniform function");
		}
		} /* switch (uniform_function) */

		/* Make sure GL_INVALID_VALUE was generated */
		glw::GLenum error_code = gl.getError();

		if (error_code != GL_INVALID_VALUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Function " << getUniformFunctionString(uniform_function)
							   << "() "
								  "was called with a negative count argument but did not generate a "
								  "GL_INVALID_VALUE error"
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all uniform functions) */

	return result;
}